

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isLifetimeModifier(TokenKind kind)

{
  undefined2 in_register_0000003a;
  
  return CONCAT22(in_register_0000003a,kind) == 0x67 || CONCAT22(in_register_0000003a,kind) == 0x11c
  ;
}

Assistant:

bool SyntaxFacts::isLifetimeModifier(TokenKind kind) {
    switch (kind) {
        case TokenKind::StaticKeyword:
        case TokenKind::AutomaticKeyword:
            return true;
        default:
            return false;
    }
}